

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

QualifiedIdentifier * __thiscall
soul::StructuralParser::parseQualifiedIdentifier(StructuralParser *this)

{
  ArrayWithPreallocation<soul::Identifier,_8UL> *other;
  char *pcVar1;
  bool bVar2;
  QualifiedIdentifier *this_00;
  Identifier IVar3;
  ArrayWithPreallocation<soul::Identifier,_8UL> *this_01;
  pool_ptr<soul::AST::Expression> s;
  IdentifierPath path;
  pool_ptr<soul::AST::Expression> local_158;
  UTF8Reader local_150;
  pool_ptr<soul::AST::Expression> local_148;
  undefined1 local_140 [8];
  ArrayWithPreallocation<soul::Identifier,_8UL> local_138;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_e0;
  ArrayWithPreallocation<soul::Identifier,_8UL> local_88;
  
  getContext((Context *)(local_140 + 8),this);
  this_00 = allocate<soul::AST::QualifiedIdentifier,soul::AST::Context>
                      (this,(Context *)(local_140 + 8));
  other = (ArrayWithPreallocation<soul::Identifier,_8UL> *)(local_140 + 8);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr((RefCountedPtr<soul::SourceCodeText> *)other);
  do {
    IVar3 = parseIdentifier(this);
    IdentifierPath::IdentifierPath((IdentifierPath *)other,IVar3);
    while( true ) {
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a2866);
      if (!bVar2) break;
      IVar3 = parseIdentifier(this);
      IdentifierPath::addSuffix((IdentifierPath *)other,IVar3);
    }
    pcVar1 = (this->super_SOULTokeniser).location.location.data;
    parseSpecialisationArgs((StructuralParser *)local_140);
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a2866);
    if (bVar2) {
      ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation(&local_88,other);
      local_148.object = (Expression *)local_140;
      this_01 = &local_88;
      AST::QualifiedIdentifier::addToPath(this_00,(IdentifierPath *)this_01,&local_148);
    }
    else {
      local_150.data = pcVar1;
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::resetPosition(&this->super_SOULTokeniser,&local_150);
      ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation(&local_e0,other);
      local_158.object = (Expression *)0x0;
      this_01 = &local_e0;
      AST::QualifiedIdentifier::addToPath(this_00,(IdentifierPath *)this_01,&local_158);
    }
    ArrayWithPreallocation<soul::Identifier,_8UL>::clear(this_01);
    ArrayWithPreallocation<soul::Identifier,_8UL>::clear(other);
  } while (bVar2);
  return this_00;
}

Assistant:

AST::QualifiedIdentifier& parseQualifiedIdentifier()
    {
        auto& qi = allocate<AST::QualifiedIdentifier> (getContext());

        for (;;)
        {
            IdentifierPath path (parseIdentifier());

            while (matchIf (Operator::doubleColon))
                path.addSuffix (parseIdentifier());

            auto p = getCurrentTokeniserPosition();
            auto s = parseSpecialisationArgs();

            if (matchIf (Operator::doubleColon))
            {
                qi.addToPath (path, s);
                continue;
            }

            resetPosition (p);
            qi.addToPath (path, nullptr);
            return qi;
        }
    }